

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<FCastSound,_FCastSound>::Reserve(TArray<FCastSound,_FCastSound> *this,uint amount)

{
  uint uVar1;
  FString *pFVar2;
  ulong uVar3;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar3 = (ulong)uVar1;
  this->Count = amount + uVar1;
  pFVar2 = &this->Array[uVar3].mSound;
  for (; uVar3 < amount + uVar1; uVar3 = uVar3 + 1) {
    pFVar2->Chars = (char *)0x71deec;
    pFVar2 = pFVar2 + 2;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}